

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pump.cpp
# Opt level: O0

bool __thiscall
Pump::changeSetting(Pump *this,double s,bool makeChange,string *reason,ostream *msgLog)

{
  ostream *poVar1;
  ostream *msgLog_local;
  string *reason_local;
  bool makeChange_local;
  double s_local;
  Pump *this_local;
  
  if ((this->speed != s) || (NAN(this->speed) || NAN(s))) {
    if (((this->super_Link).status != 0) || ((s != 0.0 || (NAN(s))))) {
      if (makeChange) {
        if ((s != 0.0) || (NAN(s))) {
          (this->super_Link).status = 1;
        }
        else {
          (this->super_Link).status = 0;
          (this->super_Link).flow = 1e-06;
        }
        this->speed = s;
        poVar1 = std::operator<<(msgLog,"\n    ");
        std::operator<<(poVar1,(string *)reason);
      }
      this_local._7_1_ = true;
    }
    else {
      this->speed = s;
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Pump::changeSetting(double s, bool makeChange, const string reason, ostream& msgLog)
{
    if ( speed != s )
    {
        if ( status == Link::LINK_CLOSED && s == 0.0 )
        {
            speed = s;
            return false;
        }

        if ( makeChange )
        {
            if ( s == 0.0 )
            {
                status = Link::LINK_CLOSED;
                flow = ZERO_FLOW;
            }
            else status = Link::LINK_OPEN;
            speed = s;
            msgLog << "\n    " << reason;
        }
        return true;
    }
    return false;
}